

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O2

ptr<buffer> __thiscall nuraft::buffer::expand(buffer *this,buffer *buf,uint32_t new_size)

{
  uint *puVar1;
  uint uVar2;
  out_of_range *this_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ptr<buffer> pVar6;
  
  if ((int)new_size < 0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range
              (this_00,"size exceed the max size that nuraft::buffer could support");
  }
  else {
    uVar3 = 0x7fffffff;
    if (-1 < (int)*(uint *)buf) {
      uVar3 = 0xffff;
    }
    if ((uVar3 & *(uint *)buf) <= new_size) {
      alloc(this,(ulong)new_size);
      uVar3 = *(uint *)buf;
      uVar5 = 0x7fffffff;
      if (-1 < (int)uVar3) {
        uVar5 = 0xffff;
      }
      memcpy(*(uint **)this + (ulong)(**(uint **)this >> 0x1f) + 1,
             buf + (ulong)(uVar3 >> 0x1f) * 4 + 4,(ulong)(uVar5 & uVar3));
      puVar1 = *(uint **)this;
      if ((int)*(uint *)buf < 0) {
        uVar3 = *(uint *)(buf + 4);
      }
      else {
        uVar3 = *(uint *)buf >> 0x10;
      }
      uVar5 = *puVar1;
      uVar4 = 0x7fffffff;
      if (-1 < (int)uVar5) {
        uVar4 = 0xffff;
      }
      uVar2 = uVar4 & uVar5;
      if (uVar3 <= (uVar4 & uVar5)) {
        uVar2 = uVar3;
      }
      if ((int)uVar5 < 0) {
        puVar1[1] = uVar2;
      }
      else {
        *(short *)((long)puVar1 + 2) = (short)uVar2;
      }
      pVar6.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
           uVar2;
      pVar6.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
      pVar6.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           0;
      return (ptr<buffer>)pVar6.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
    }
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"realloc() new_size is less than old size");
  }
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

ptr<buffer> buffer::expand(const buffer& buf, uint32_t new_size) {
     if (new_size >= 0x80000000) {
        throw std::out_of_range( "size exceed the max size that "
                                 "nuraft::buffer could support" );
    }

    if (new_size < buf.size()) {
        throw std::out_of_range( "realloc() new_size is less than "
                                 "old size" );
    }
    ptr<buffer> other = alloc(new_size);
    byte* dst = other->data_begin();
    byte* src = buf.data_begin();
    ::memcpy(dst, src, buf.size());
    other->pos(buf.pos());
    return other;
}